

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetParser.cpp
# Opt level: O3

uint __thiscall llvm::ARM::parseHWDiv(ARM *this,StringRef HWDiv)

{
  int iVar1;
  char *__n;
  long lVar2;
  
  __n = HWDiv.Data;
  if ((__n == (char *)0x9) && (this[8] == (ARM)0x6d && *(long *)this == 0x72612c626d756874)) {
    this = (ARM *)"arm,thumb";
  }
  lVar2 = 0;
  while ((*(char **)((long)&DAT_00252b08 + lVar2) != __n ||
         ((__n != (char *)0x0 &&
          (iVar1 = bcmp(this,*(void **)((long)&(anonymous_namespace)::HWDivNames + lVar2),
                        (size_t)__n), iVar1 != 0))))) {
    lVar2 = lVar2 + 0x18;
    if (lVar2 == 0x78) {
      return 0;
    }
  }
  return *(uint *)((long)&DAT_00252b10 + lVar2);
}

Assistant:

unsigned llvm::ARM::parseHWDiv(StringRef HWDiv) {
  StringRef Syn = getHWDivSynonym(HWDiv);
  for (const auto D : HWDivNames) {
    if (Syn == D.getName())
      return D.ID;
  }
  return ARM::AEK_INVALID;
}